

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O1

DdNode * cuddBddBooleanDiffRecur(DdManager *manager,DdNode *f,DdNode *var)

{
  int *piVar1;
  uint uVar2;
  DdNode *g;
  DdNode *data;
  int iVar3;
  DdNode *pDVar4;
  
  uVar2 = f->index;
  iVar3 = 0x7fffffff;
  if ((ulong)uVar2 != 0x7fffffff) {
    iVar3 = manager->perm[uVar2];
  }
  if (manager->perm[var->index] < iVar3) {
    pDVar4 = (DdNode *)((ulong)manager->one ^ 1);
  }
  else {
    if (uVar2 == var->index) {
      pDVar4 = cuddBddXorRecur(manager,(f->type).kids.T,(f->type).kids.E);
      return pDVar4;
    }
    pDVar4 = cuddCacheLookup2(manager,cuddBddBooleanDiffRecur,f,var);
    if (pDVar4 == (DdNode *)0x0) {
      pDVar4 = (f->type).kids.E;
      g = cuddBddBooleanDiffRecur(manager,(f->type).kids.T,var);
      if (g != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = cuddBddBooleanDiffRecur(manager,(DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe),var)
        ;
        if (pDVar4 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          data = cuddBddIteRecur(manager,manager->vars[f->index],g,pDVar4);
          if (data != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            cuddCacheInsert2(manager,cuddBddBooleanDiffRecur,f,var,data);
            return data;
          }
          Cudd_IterDerefBdd(manager,g);
          g = pDVar4;
        }
        Cudd_IterDerefBdd(manager,g);
      }
      pDVar4 = (DdNode *)0x0;
    }
  }
  return pDVar4;
}

Assistant:

DdNode *
cuddBddBooleanDiffRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * var)
{
    DdNode *T, *E, *res, *res1, *res2;

    statLine(manager);
    if (cuddI(manager,f->index) > manager->perm[var->index]) {
        /* f does not depend on var. */
        return(Cudd_Not(DD_ONE(manager)));
    }

    /* From now on, f is non-constant. */

    /* If the two indices are the same, so are their levels. */
    if (f->index == var->index) {
        res = cuddBddXorRecur(manager, cuddT(f), cuddE(f));
        return(res);
    }

    /* From now on, cuddI(manager,f->index) < cuddI(manager,cube->index). */

    /* Check the cache. */
    res = cuddCacheLookup2(manager, cuddBddBooleanDiffRecur, f, var);
    if (res != NULL) {
        return(res);
    }

    /* Compute the cofactors of f. */
    T = cuddT(f); E = cuddE(f);

    res1 = cuddBddBooleanDiffRecur(manager, T, var);
    if (res1 == NULL) return(NULL);
    cuddRef(res1);
    res2 = cuddBddBooleanDiffRecur(manager, Cudd_Regular(E), var);
    if (res2 == NULL) {
        Cudd_IterDerefBdd(manager, res1);
        return(NULL);
    }
    cuddRef(res2);
    /* ITE takes care of possible complementation of res1 and of the
    ** case in which res1 == res2. */
    res = cuddBddIteRecur(manager, manager->vars[f->index], res1, res2);
    if (res == NULL) {
        Cudd_IterDerefBdd(manager, res1);
        Cudd_IterDerefBdd(manager, res2);
        return(NULL);
    }
    cuddDeref(res1);
    cuddDeref(res2);
    cuddCacheInsert2(manager, cuddBddBooleanDiffRecur, f, var, res);
    return(res);

}